

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhashfunctions.h
# Opt level: O2

QPropertyBindingData * __thiscall
QBindingStoragePrivate::get(QBindingStoragePrivate *this,QUntypedPropertyData *data)

{
  QBindingStorageData *pQVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = ((ulong)data >> 0x20 ^ (ulong)data) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  pQVar1 = *this->d;
  sVar3 = pQVar1->size - 1 & (uVar2 >> 0x20 ^ uVar2);
  while( true ) {
    if ((QUntypedPropertyData *)pQVar1[sVar3 + 1].size == (QUntypedPropertyData *)0x0) {
      return (QPropertyBindingData *)0x0;
    }
    if ((QUntypedPropertyData *)pQVar1[sVar3 + 1].size == data) break;
    sVar3 = sVar3 + 1;
    if (sVar3 == pQVar1->size) {
      sVar3 = 0;
    }
  }
  return (QPropertyBindingData *)&pQVar1[sVar3 + 1].used;
}

Assistant:

Q_DECL_CONST_FUNCTION constexpr size_t hash(size_t key, size_t seed) noexcept
{
    key ^= seed;
    if constexpr (sizeof(size_t) == 4) {
        key ^= key >> 16;
        key *= UINT32_C(0x45d9f3b);
        key ^= key >> 16;
        key *= UINT32_C(0x45d9f3b);
        key ^= key >> 16;
        return key;
    } else {
        quint64 key64 = key;
        key64 ^= key64 >> 32;
        key64 *= UINT64_C(0xd6e8feb86659fd93);
        key64 ^= key64 >> 32;
        key64 *= UINT64_C(0xd6e8feb86659fd93);
        key64 ^= key64 >> 32;
        return size_t(key64);
    }
}